

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_local.h
# Opt level: O2

TVMRuntimeEntry * dmlc::ThreadLocalStore<TVMRuntimeEntry>::Get(void)

{
  long lVar1;
  long *in_FS_OFFSET;
  
  if ((char)in_FS_OFFSET[-1] == '\0') {
    lVar1 = *in_FS_OFFSET;
    in_FS_OFFSET[-0xb] = lVar1 + -0x48;
    in_FS_OFFSET[-10] = 0;
    *(undefined1 *)(in_FS_OFFSET + -9) = 0;
    in_FS_OFFSET[-7] = lVar1 + -0x28;
    in_FS_OFFSET[-6] = 0;
    *(undefined1 *)(in_FS_OFFSET + -5) = 0;
    __cxa_thread_atexit(TVMRuntimeEntry::~TVMRuntimeEntry,lVar1 + -0x58,&__dso_handle);
    *(undefined1 *)(in_FS_OFFSET + -1) = 1;
  }
  return (TVMRuntimeEntry *)(*in_FS_OFFSET + -0x58);
}

Assistant:

static T *Get() {
#if DMLC_CXX11_THREAD_LOCAL
    static thread_local T inst;
    return &inst;
#else
    static MX_THREAD_LOCAL T *ptr = nullptr;
    if (ptr == nullptr) {
      ptr = new T();
      Singleton()->RegisterDelete(ptr);
    }
    return ptr;
#endif
  }